

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O0

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,int numViewports)

{
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  Context *context_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  MovePtr *vk_00;
  VkDevice device_00;
  Allocator *allocator_00;
  VkDeviceSize bufferSize;
  Handle<(vk::HandleType)8> *pHVar5;
  Allocation *pAVar6;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  void *data_01;
  MovePtr *this;
  undefined4 uVar10;
  undefined4 uVar11;
  allocator<char> local_751;
  string local_750;
  uint local_730;
  allocator<char> local_729;
  string local_728;
  Vector<float,_4> local_708;
  ConstPixelBufferAccess local_6f8;
  TextureFormat local_6d0;
  undefined1 local_6c8 [8];
  TextureLevel referenceImage;
  undefined1 local_698 [8];
  ConstPixelBufferAccess resultImage;
  undefined1 local_660 [8];
  ScissorRenderer_conflict renderer;
  MessageBuilder local_300;
  deUint32 local_17c;
  deUint64 local_178;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_170;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_160;
  undefined1 local_150 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> local_108;
  RefData<vk::Handle<(vk::HandleType)8>_> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  VkDeviceSize colorBufferSize;
  undefined1 local_88 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> scissors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexColors;
  Vec4 clearColor;
  VkFormat colorFormat;
  IVec2 renderSize;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  Context *pCStack_18;
  int numViewports_local;
  Context *context_local;
  
  vk._4_4_ = numViewports;
  pCStack_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(pCStack_18);
  requireFeatureMultiViewport(vki,physDevice);
  vk_00 = (MovePtr *)Context::getDeviceInterface(pCStack_18);
  device_00 = Context::getDevice(pCStack_18);
  allocator_00 = Context::getDefaultAllocator(pCStack_18);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(clearColor.m_data + 3),0x80,0x80);
  clearColor.m_data[2] = 5.1848e-44;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&vertexColors.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0.5,0.5,0.5,1.0);
  generateColors((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &scissors.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,vk._4_4_);
  generateScissors((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88,
                   vk._4_4_,(IVec2 *)(clearColor.m_data + 3));
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(clearColor.m_data + 3));
  iVar3 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(clearColor.m_data + 3));
  colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar4 = tcu::getPixelSize((TextureFormat)
                            colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
                            .m_allocator);
  bufferSize = (VkDeviceSize)(iVar2 * iVar3 * iVar4);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)
             &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.field_0x8,bufferSize,2);
  makeBuffer(&local_108,(DeviceInterface *)vk_00,device_00,
             (VkBufferCreateInfo *)
             &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.field_0x8);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  uVar10 = (undefined4)local_e8.object.m_internal;
  uVar11 = (undefined4)(local_e8.object.m_internal >> 0x20);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device = local_e8.deleter.m_device;
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_c8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_108);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_c8);
  local_178 = pHVar5->m_internal;
  local_17c = ::vk::MemoryRequirement::HostVisible.m_flags;
  this = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_170,
             (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)local_178,
             ::vk::MemoryRequirement::HostVisible);
  local_160 = de::details::MovePtr::operator_cast_to_PtrData(&local_170,this);
  data.ptr._4_4_ = uVar11;
  data.ptr._0_4_ = uVar10;
  data._8_8_ = local_e8.deleter.m_deviceIface;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_150,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_170);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_150);
  zeroBuffer((DeviceInterface *)vk_00,device_00,pAVar6,bufferSize);
  pTVar7 = Context::getTestContext(pCStack_18);
  pTVar8 = tcu::TestContext::getLog(pTVar7);
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &renderer.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      &renderer.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                       m_pool,(char (*) [30])"Rendering a colorful grid of ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)((long)&vk + 4));
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])" rectangle(s).");
  pTVar8 = tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_300,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     (&local_300,(char (*) [51])"Not covered area will be filled with a gray color."
                     );
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_300);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &renderer.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ScissorRenderer::ScissorRenderer
            ((ScissorRenderer *)local_660,pCStack_18,(IVec2 *)(clearColor.m_data + 3),vk._4_4_,
             (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88,
             VK_FORMAT_R8G8B8A8_UNORM,
             (Vec4 *)((long)&vertexColors.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &scissors.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  context_00 = pCStack_18;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_c8);
  ScissorRenderer::draw((ScissorRenderer *)local_660,context_00,(VkBuffer)pHVar5->m_internal);
  ScissorRenderer::~ScissorRenderer((ScissorRenderer *)local_660);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_150);
  resultImage.m_data = (void *)::vk::Allocation::getMemory(pAVar6);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,(VkDeviceMemory)resultImage.m_data,0,bufferSize);
  referenceImage.m_data.m_cap = (size_t)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(clearColor.m_data + 3));
  iVar3 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(clearColor.m_data + 3));
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_150);
  data_01 = ::vk::Allocation::getHostPtr(pAVar6);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_698,(TextureFormat *)&referenceImage.m_data.m_cap,iVar2
             ,iVar3,1,data_01);
  local_6d0 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  generateReferenceImage
            ((TextureLevel *)local_6c8,local_6d0,(IVec2 *)(clearColor.m_data + 3),
             (Vec4 *)((long)&vertexColors.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &scissors.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  pTVar7 = Context::getTestContext(pCStack_18);
  pTVar8 = tcu::TestContext::getLog(pTVar7);
  tcu::TextureLevel::getAccess(&local_6f8,(TextureLevel *)local_6c8);
  tcu::Vector<float,_4>::Vector(&local_708,0.02);
  bVar1 = tcu::floatThresholdCompare
                    (pTVar8,"color","Image compare",&local_6f8,(ConstPixelBufferAccess *)local_698,
                     &local_708,COMPARE_LOG_RESULT);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_728,"Rendered image is not correct",&local_729);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_728);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
  }
  local_730 = (uint)bVar1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_6c8);
  if (local_730 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"OK",&local_751);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_750);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator(&local_751);
    local_730 = 1;
  }
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_150);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_c8);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &scissors.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const int numViewports)
{
	requireFeatureMultiViewport(context.getInstanceInterface(), context.getPhysicalDevice());

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec2						renderSize			(128, 128);
	const VkFormat					colorFormat			= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						clearColor			(0.5f, 0.5f, 0.5f, 1.0f);
	const std::vector<Vec4>			vertexColors		= generateColors(numViewports);
	const std::vector<IVec4>		scissors			= generateScissors(numViewports, renderSize);

	const VkDeviceSize				colorBufferSize		= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Rendering a colorful grid of " << numViewports << " rectangle(s)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Not covered area will be filled with a gray color." << tcu::TestLog::EndMessage;
	}

	// Draw
	{
		const ScissorRenderer renderer (context, renderSize, numViewports, scissors, colorFormat, clearColor, vertexColors);
		renderer.draw(context, *colorBuffer);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferAlloc->getHostPtr());
		const tcu::TextureLevel				referenceImage	= generateReferenceImage(mapVkFormat(colorFormat), renderSize, clearColor, scissors, vertexColors);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage.getAccess(), resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}